

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckUniformDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  Decoration *inst_00;
  Instruction *pIVar1;
  Decoration DVar2;
  uint32_t uVar3;
  Op OVar4;
  spv_result_t sVar5;
  DiagnosticStream *pDVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  undefined1 local_5c0 [4];
  spv_result_t error;
  DiagnosticStream local_3e8;
  Instruction *local_210;
  Instruction *type_inst;
  char *local_30;
  char *dec_name;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  dec_name = (char *)decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  DVar2 = Decoration::dec_type(decoration);
  local_30 = "UniformId";
  if (DVar2 == DecorationUniform) {
    local_30 = "Uniform";
  }
  uVar3 = Instruction::type_id((Instruction *)decoration_local);
  pIVar1 = inst_local;
  if (uVar3 == 0) {
    ValidationState_t::diag
              ((DiagnosticStream *)&type_inst,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)decoration_local);
    pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)&type_inst,&local_30);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(char (*) [36])" decoration applied to a non-object");
    vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_inst);
  }
  else {
    uVar3 = Instruction::type_id((Instruction *)decoration_local);
    local_210 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar3);
    if (local_210 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 (Instruction *)decoration_local);
      pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)local_5c0,&local_30);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [51])" decoration applied to an object with invalid type"
                         );
      vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5c0);
    }
    else {
      OVar4 = Instruction::opcode(local_210);
      if (OVar4 == OpTypeVoid) {
        ValidationState_t::diag
                  (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                   (Instruction *)decoration_local);
        pDVar6 = DiagnosticStream::operator<<(&local_3e8,&local_30);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [46])" decoration applied to a value with void type");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
      }
      else {
        DVar2 = Decoration::dec_type((Decoration *)dec_name);
        if (DVar2 == DecorationUniformId) {
          pvVar7 = Decoration::params((Decoration *)dec_name);
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
          pIVar1 = inst_local;
          inst_00 = decoration_local;
          if (sVar8 != 1) {
            __assert_fail("decoration.params().size() == 1 && \"Grammar ensures UniformId has one parameter\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x6fa,
                          "spv_result_t spvtools::val::(anonymous namespace)::CheckUniformDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                         );
          }
          pvVar7 = Decoration::params((Decoration *)dec_name);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar7,0);
          sVar5 = ValidateExecutionScope((ValidationState_t *)pIVar1,(Instruction *)inst_00,*pvVar9)
          ;
          if (sVar5 != SPV_SUCCESS) {
            return sVar5;
          }
        }
        vstate_local._4_4_ = SPV_SUCCESS;
      }
    }
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckUniformDecoration(ValidationState_t& vstate,
                                    const Instruction& inst,
                                    const Decoration& decoration) {
  const char* const dec_name = decoration.dec_type() == spv::Decoration::Uniform
                                   ? "Uniform"
                                   : "UniformId";

  // Uniform or UniformId must decorate an "object"
  //  - has a result ID
  //  - is an instantiation of a non-void type.  So it has a type ID, and that
  //  type is not void.

  // We already know the result ID is non-zero.

  if (inst.type_id() == 0) {
    return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
           << dec_name << " decoration applied to a non-object";
  }
  if (Instruction* type_inst = vstate.FindDef(inst.type_id())) {
    if (type_inst->opcode() == spv::Op::OpTypeVoid) {
      return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
             << dec_name << " decoration applied to a value with void type";
    }
  } else {
    // We might never get here because this would have been rejected earlier in
    // the flow.
    return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
           << dec_name << " decoration applied to an object with invalid type";
  }

  // Use of Uniform with OpDecorate is checked elsewhere.
  // Use of UniformId with OpDecorateId is checked elsewhere.

  if (decoration.dec_type() == spv::Decoration::UniformId) {
    assert(decoration.params().size() == 1 &&
           "Grammar ensures UniformId has one parameter");

    // The scope id is an execution scope.
    if (auto error =
            ValidateExecutionScope(vstate, &inst, decoration.params()[0]))
      return error;
  }

  return SPV_SUCCESS;
}